

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  uint uVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmFileTimeCache *this_00;
  pointer pcVar4;
  pointer pcVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Encoding EVar10;
  string *psVar11;
  uint7 extraout_var;
  undefined7 extraout_var_00;
  path *this_01;
  undefined7 in_register_00000009;
  char *extraout_RDX;
  undefined4 uVar12;
  uint7 uVar13;
  bool bVar14;
  bool bVar15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  int result;
  int result_1;
  string depends;
  string targetDir;
  string internalDependFile;
  cmDependsCompiler depsManager;
  string targetName_1;
  cmList depFiles;
  DependencyMap validDependencies;
  cmDependsC checker;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  string local_e70;
  undefined4 local_e50;
  undefined4 local_e4c;
  string local_e48;
  undefined1 local_e28 [32];
  _Base_ptr local_e08;
  size_t local_e00;
  cmDependsCompiler local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  cmList local_da8;
  undefined1 local_d90 [32];
  _List local_d70;
  size_t local_d68;
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  _List local_b08;
  size_type local_b00;
  undefined1 local_af8 [16];
  _Alloc_hider local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  pointer local_ac8;
  pointer local_ac0;
  pointer local_ab8;
  
  local_e50 = (undefined4)CONCAT71(in_register_00000009,color);
  bVar7 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((((!bVar7) || (cmSystemTools::s_ErrorOccurred != false)) ||
      (cmSystemTools::s_FatalErrorOccurred != false)) ||
     (bVar7 = cmSystemTools::GetInterruptFlag(), bVar7)) {
    local_b28._0_8_ = local_b18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b28,"Target DependInfo.cmake file not found","");
    cmSystemTools::Error((string *)local_b28);
    if ((undefined1 *)local_b28._0_8_ != local_b18) {
      operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
    }
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&local_e48,tgtInfo);
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_b28._0_8_ = local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"CMAKE_DEPENDS_LANGUAGES","");
  psVar11 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_b28);
  sVar3 = psVar11->_M_string_length;
  if ((undefined1 *)local_b28._0_8_ != local_b18) {
    operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
  }
  uVar13 = (uint7)((ulong)tgtInfo >> 8);
  if (sVar3 == 0) {
    uVar12 = (undefined4)CONCAT71(uVar13,1);
  }
  else {
    local_e28._0_8_ = local_e28 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e28,local_e48._M_dataplus._M_p,
               local_e48._M_dataplus._M_p + local_e48._M_string_length);
    std::__cxx11::string::append(local_e28);
    local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e70,local_e48._M_dataplus._M_p,
               local_e48._M_dataplus._M_p + local_e48._M_string_length);
    std::__cxx11::string::append((char *)&local_e70);
    this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               CMakeInstance->FileTimeCache)._M_t.
              super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
              super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
              super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
    bVar7 = cmFileTimeCache::Compare(this_00,(string *)local_e28,tgtInfo,(int *)&local_eb8);
    bVar14 = -1 < (int)local_eb8._M_dataplus._M_p;
    if (verbose && (!bVar7 || !bVar14)) {
      local_b28._0_8_ = (pointer)0xa;
      local_b28._8_8_ = "Dependee \"";
      local_b18._0_8_ = (code *)0x0;
      local_b08._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(tgtInfo->_M_dataplus)._M_p;
      local_b18._8_8_ = tgtInfo->_M_string_length;
      local_b00 = 0;
      local_af8._0_8_ = 0x1a;
      local_af8._8_8_ = "\" is newer than depender \"";
      local_ae8._M_p = (pointer)0x0;
      local_ad8._M_allocated_capacity = local_e28._0_8_;
      local_ad8._8_8_ = 0;
      local_ac8 = (pointer)0x3;
      local_ac0 = (pointer)0x7d43fa;
      local_ab8 = (pointer)0x0;
      views._M_len = 5;
      views._M_array = (iterator)local_b28;
      cmCatViews((string *)local_d90,views);
      cmSystemTools::Stdout((string *)local_d90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d90 + 0x10)) {
        operator_delete((void *)local_d90._0_8_,local_d90._16_8_ + 1);
      }
    }
    psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    local_b28._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_b28._0_8_ = psVar11->_M_string_length;
    local_b18._0_8_ = (code *)0x0;
    local_b18._8_8_ = (cmFileTimeCache *)0x2b;
    local_b08._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x7fc05b;
    local_b00 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_b28;
    cmCatViews((string *)local_d90,views_00);
    bVar8 = cmFileTimeCache::Compare
                      (this_00,(string *)local_e28,(string *)local_d90,(int *)&local_e90);
    bVar15 = -1 < (int)local_e90._M_dataplus._M_p;
    if (bVar8 && bVar15) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d90 + 0x10)) {
        operator_delete((void *)local_d90._0_8_,local_d90._16_8_ + 1);
      }
      local_d90._24_8_ = (long)local_d90 + 8;
      local_d90._8_4_ = _S_red;
      local_d90._16_8_ = 0;
      local_d68 = 0;
      local_d70._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )local_d90._24_8_;
      cmDependsC::cmDependsC((cmDependsC *)local_b28);
      local_b18[0] = verbose;
      local_b18._8_8_ = this_00;
      bVar9 = cmDepends::Check((cmDepends *)local_b28,&local_e70,(string *)local_e28,
                               (DependencyMap *)local_d90);
      uVar13 = extraout_var & 0xffffff;
      cmDependsC::~cmDependsC((cmDependsC *)local_b28);
    }
    else {
      if (verbose) {
        local_b28._0_8_ = (pointer)0xa;
        local_b28._8_8_ = "Dependee \"";
        local_b18._0_8_ = (code *)0x0;
        local_b18._8_8_ = CONCAT44(local_d90._12_4_,local_d90._8_4_);
        local_b08._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )local_d90._0_8_;
        local_b00 = 0;
        local_af8._0_8_ = 0x1a;
        local_af8._8_8_ = "\" is newer than depender \"";
        local_ae8._M_p = (pointer)0x0;
        local_ad8._M_allocated_capacity = local_e28._0_8_;
        local_ad8._8_8_ = 0;
        local_ac8 = (pointer)0x3;
        local_ac0 = (pointer)0x7d43fa;
        local_ab8 = (pointer)0x0;
        views_01._M_len = 5;
        views_01._M_array = (iterator)local_b28;
        cmCatViews(&local_eb8,views_01);
        cmSystemTools::Stdout(&local_eb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
          operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d90 + 0x10)) {
        operator_delete((void *)local_d90._0_8_,local_d90._16_8_ + 1);
      }
      local_d90._24_8_ = (long)local_d90 + 8;
      local_d90._8_4_ = _S_red;
      local_d90._16_8_ = 0;
      local_d68 = 0;
      bVar9 = true;
      local_d70._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )local_d90._24_8_;
    }
    uVar12 = (undefined4)CONCAT71(uVar13,1);
    if (((bVar7 && bVar14) & (bVar8 && bVar15) & bVar9) == 0) {
      if (verbose) {
        cmsys::SystemTools::GetFilenameName(&local_eb8,&local_e48);
        std::__cxx11::string::substr((ulong)local_b28,(ulong)&local_eb8);
        std::__cxx11::string::operator=((string *)&local_eb8,(string *)local_b28);
        if ((undefined1 *)local_b28._0_8_ != local_b18) {
          operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
        }
        local_b28._0_8_ = (pointer)0x20;
        local_b28._8_8_ = "Scanning dependencies of target ";
        local_b18._0_8_ = (code *)0x0;
        local_b18._8_8_ = local_eb8._M_string_length;
        local_b08._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )local_eb8._M_dataplus._M_p;
        local_b00 = 0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_b28;
        cmCatViews(&local_e90,views_02);
        cmSystemTools::MakefileColorEcho(0x106,local_e90._M_dataplus._M_p,true,local_e50._0_1_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
          operator_delete(local_e90._M_dataplus._M_p,local_e90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
          operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
        }
      }
      bVar7 = ScanDependencies(this,&local_e48,&local_e70,(string *)local_e28,
                               (DependencyMap *)local_d90);
      uVar12 = (undefined4)CONCAT71(extraout_var_00,bVar7);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_d90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
      operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e28._0_8_ != local_e28 + 0x10) {
      operator_delete((void *)local_e28._0_8_,local_e28._16_8_ + 1);
    }
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_e4c = uVar12;
  local_b28._0_8_ = local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b28,"CMAKE_DEPENDS_DEPENDENCY_FILES","");
  psVar11 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_b28);
  local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
  pcVar4 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e70,pcVar4,pcVar4 + psVar11->_M_string_length);
  if ((undefined1 *)local_b28._0_8_ != local_b18) {
    operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
  }
  if (local_e70._M_string_length == 0) goto LAB_004b765f;
  cmList::cmList(&local_da8,&local_e70,Yes,Yes);
  local_eb8._M_dataplus._M_p = (pointer)&local_eb8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_eb8,local_e48._M_dataplus._M_p,
             local_e48._M_dataplus._M_p + local_e48._M_string_length);
  std::__cxx11::string::append((char *)&local_eb8);
  local_e90._M_dataplus._M_p = (pointer)&local_e90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_e48._M_dataplus._M_p,
             local_e48._M_dataplus._M_p + local_e48._M_string_length);
  std::__cxx11::string::append((char *)&local_e90);
  local_e28._24_8_ = local_e28 + 8;
  local_e28._8_4_ = _S_red;
  local_e28._16_8_ = 0;
  local_e00 = 0;
  local_df8.Verbose = false;
  local_df8.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_e08 = (_Base_ptr)local_e28._24_8_;
  local_b28._0_8_ = local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b28,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
  psVar11 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_b28);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar11->_M_dataplus)._M_p;
  bVar7 = cmValue::IsOn((cmValue *)psVar11->_M_string_length,value);
  if ((undefined1 *)local_b28._0_8_ != local_b18) {
    operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
  }
  local_df8.Verbose = verbose;
  local_df8.LocalGenerator = this;
  if (bVar7) {
    psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar4 = (psVar11->_M_dataplus)._M_p;
    sVar3 = psVar11->_M_string_length;
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    sVar6 = psVar11->_M_string_length;
    local_b18._0_8_ = 0;
    local_b18._8_8_ = 0;
    local_b28._0_8_ = (pointer)0x0;
    local_b28._8_8_ = (cmLocalUnixMakefileGenerator3 *)0x0;
    local_b28._0_8_ = operator_new(0x20);
    *(size_type *)local_b28._0_8_ = sVar3;
    *(pointer *)(local_b28._0_8_ + 8) = pcVar4;
    *(size_type *)(local_b28._0_8_ + 0x10) = sVar6;
    *(pointer *)(local_b28._0_8_ + 0x18) = pcVar5;
    local_b18._8_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_invoke;
    local_b18._0_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_manager;
  }
  else {
    local_b18._0_8_ = (code *)0x0;
    local_b18._8_8_ = (cmFileTimeCache *)0x0;
    local_b28._0_8_ = (size_type *)0x0;
    local_b28._8_8_ = (cmLocalUnixMakefileGenerator3 *)0x0;
  }
  bVar7 = cmDependsCompiler::CheckDependencies
                    (&local_df8,&local_eb8,&local_da8.Values,(DependencyMap *)local_e28,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_b28);
  if ((code *)local_b18._0_8_ != (code *)0x0) {
    (*(code *)local_b18._0_8_)(local_b28,local_b28,3);
  }
  if (bVar7) {
LAB_004b73b4:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_e28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
      operator_delete(local_e90._M_dataplus._M_p,local_e90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
      operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_da8.Values);
    goto LAB_004b765f;
  }
  if (verbose) {
    local_de8._M_dataplus._M_p = (pointer)&local_de8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_de8,local_e48._M_dataplus._M_p,
               local_e48._M_dataplus._M_p + local_e48._M_string_length);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)local_d90,&local_de8,generic_format);
    cmCMakePath::GetFileName((cmCMakePath *)local_b28,(cmCMakePath *)local_d90);
    this_01 = &cmCMakePath::RemoveExtension((cmCMakePath *)local_b28)->Path;
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_dc8,this_01,&local_e91);
    std::filesystem::__cxx11::path::~path((path *)local_b28);
    std::filesystem::__cxx11::path::~path((path *)local_d90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
      operator_delete(local_de8._M_dataplus._M_p,local_de8.field_2._M_allocated_capacity + 1);
    }
    local_b28._0_8_ = (size_type *)0x36;
    local_b28._8_8_ = "Consolidate compiler generated dependencies of target ";
    local_b18._0_8_ = (code *)0x0;
    local_b18._8_8_ = local_dc8._M_string_length;
    local_b08._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )local_dc8._M_dataplus._M_p;
    local_b00 = 0;
    views_03._M_len = 2;
    views_03._M_array = (iterator)local_b28;
    cmCatViews((string *)local_d90,views_03);
    cmSystemTools::MakefileColorEcho(0x106,(char *)local_d90._0_8_,true,local_e50._0_1_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d90._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d90 + 0x10)) {
      operator_delete((void *)local_d90._0_8_,local_d90._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
      operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
    }
  }
  EVar10 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
             _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_b28,&local_e90,false,EVar10);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_b28,true);
  if ((*(byte *)((long)&local_b08._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl + *(size_type *)(local_b28._0_8_ + -0x18)) & 5) == 0) {
    EVar10 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_d90,&local_eb8,false,EVar10);
    uVar1 = *(uint *)((long)&local_d70._M_impl._M_t.
                             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             .
                             super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                             ._M_head_impl + *(long *)(local_d90._0_8_ + -0x18));
    if ((uVar1 & 5) != 0) {
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_d90);
      goto LAB_004b75fe;
    }
    WriteDisclaimer(this,(ostream *)local_b28);
    WriteDisclaimer(this,(ostream *)local_d90);
    cmDependsCompiler::WriteDependencies
              (&local_df8,(DependencyMap *)local_e28,(ostream *)local_b28,(ostream *)local_d90);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_d90);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_b28);
    if ((uVar1 & 5) == 0) goto LAB_004b73b4;
  }
  else {
LAB_004b75fe:
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_b28);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_e28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
    operator_delete(local_e90._M_dataplus._M_p,local_e90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
    operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da8.Values);
  local_e4c = 0;
LAB_004b765f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
  }
  uVar12 = local_e4c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._M_dataplus._M_p != &local_e48.field_2) {
    operator_delete(local_e48._M_dataplus._M_p,local_e48.field_2._M_allocated_capacity + 1);
  }
  return SUB41(uVar12,0);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    cmList depFiles{ depends, cmList::EmptyElements::Yes };
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}